

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Parser.h
# Opt level: O1

Statement * __thiscall soul::StructuralParser::parseForLoop(StructuralParser *this)

{
  DestructorFn *pDVar1;
  Scope *pSVar2;
  char *__s1;
  bool bVar3;
  int iVar4;
  PoolItem *pPVar5;
  SourceCodeText *pSVar6;
  SourceCodeText *pSVar7;
  pool_ptr<soul::AST::Expression> pVar8;
  VariableDeclaration *pVVar9;
  Expression *pEVar10;
  Statement *pSVar11;
  Context local_88;
  undefined1 local_70 [16];
  StructurePtr local_60;
  
  Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
  ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x288ebc);
  pSVar6 = (this->super_SOULTokeniser).location.sourceCode.object;
  if (pSVar6 != (SourceCodeText *)0x0) {
    (pSVar6->super_RefCountedObject).refCount = (pSVar6->super_RefCountedObject).refCount + 1;
  }
  pDVar1 = (DestructorFn *)(this->super_SOULTokeniser).location.location.data;
  pSVar2 = this->currentScope;
  pPVar5 = PoolAllocator::allocateSpaceForObject(&this->allocator->pool,0x50);
  pPVar5->item = &PTR__ASTObject_002d4778;
  *(undefined4 *)&pPVar5->field_0x18 = 9;
  pPVar5[1].size = (size_t)pSVar6;
  if (pSVar6 != (SourceCodeText *)0x0) {
    (pSVar6->super_RefCountedObject).refCount = (pSVar6->super_RefCountedObject).refCount + 1;
  }
  pPVar5[1].destructor = pDVar1;
  pPVar5[1].item = pSVar2;
  pPVar5->item = &PTR__Block_002d6048;
  *(undefined ***)&pPVar5[1].field_0x18 = &PTR__Block_002d6090;
  pPVar5[2].size = 0;
  pPVar5[2].destructor = (DestructorFn *)0x0;
  pPVar5[2].item = (void *)0x0;
  *(undefined8 *)&pPVar5[2].field_0x18 = 0;
  pPVar5->destructor =
       PoolAllocator::allocate<soul::AST::Block,_soul::AST::Context,_std::nullptr_t>::
       anon_class_1_0_00000001::__invoke;
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(pSVar6);
  local_60.object = (Structure *)&pPVar5[1].field_0x18;
  pSVar2 = this->currentScope;
  this->currentScope = (Scope *)local_60.object;
  local_70._0_8_ = (this->super_SOULTokeniser).location.sourceCode.object;
  if ((SourceCodeText *)local_70._0_8_ != (SourceCodeText *)0x0) {
    (((SourceCodeText *)local_70._0_8_)->super_RefCountedObject).refCount =
         (((SourceCodeText *)local_70._0_8_)->super_RefCountedObject).refCount + 1;
  }
  local_70._8_8_ = (this->super_SOULTokeniser).location.location.data;
  pSVar6 = (SourceCodeText *)
           PoolAllocator::allocate<soul::AST::LoopStatement,soul::AST::Context>
                     (&this->allocator->pool,(Context *)local_70);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull((SourceCodeText *)local_70._0_8_);
  pSVar7 = (SourceCodeText *)parseStatement(this);
  local_70._0_8_ = pSVar7;
  std::
  vector<soul::pool_ref<soul::AST::Statement>,std::allocator<soul::pool_ref<soul::AST::Statement>>>
  ::emplace_back<soul::pool_ref<soul::AST::Statement>>
            ((vector<soul::pool_ref<soul::AST::Statement>,std::allocator<soul::pool_ref<soul::AST::Statement>>>
              *)&pPVar5[2].destructor,(pool_ref<soul::AST::Statement> *)local_70);
  local_70._0_8_ = pSVar6;
  std::
  vector<soul::pool_ref<soul::AST::Statement>,std::allocator<soul::pool_ref<soul::AST::Statement>>>
  ::emplace_back<soul::pool_ref<soul::AST::Statement>>
            ((vector<soul::pool_ref<soul::AST::Statement>,std::allocator<soul::pool_ref<soul::AST::Statement>>>
              *)&pPVar5[2].destructor,(pool_ref<soul::AST::Statement> *)local_70);
  __s1 = (this->super_SOULTokeniser).currentType.text;
  if (__s1 == ")") {
LAB_001e7e71:
    pVVar9 = (VariableDeclaration *)
             __dynamic_cast(pSVar7,&AST::Statement::typeinfo,&AST::VariableDeclaration::typeinfo,0);
    if (pVVar9 == (VariableDeclaration *)0x0) {
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x261d5f);
    }
    else {
      (pSVar6->utf8).data = (char *)pVVar9;
      pVVar9->doNotConstantFold = true;
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::skip(&this->super_SOULTokeniser);
    }
  }
  else {
    if (__s1 != (char *)0x0) {
      iVar4 = strcmp(__s1,")");
      if (iVar4 == 0) goto LAB_001e7e71;
    }
    bVar3 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x261d5f);
    if (bVar3) {
      local_88.location.sourceCode.object = (SourceCodeText *)0x0;
      local_88.location.location.data = (char *)0x0;
      local_88.parentScope = (Scope *)0x0;
      soul::Value::Value((Value *)local_70,true);
      pVar8.object = &PoolAllocator::allocate<soul::AST::Constant,soul::AST::Context,soul::Value>
                                (&this->allocator->pool,&local_88,(Value *)local_70)->
                      super_Expression;
      (pSVar6->content).field_2._M_allocated_capacity = (size_type)pVar8.object;
      soul::Value::~Value((Value *)local_70);
      RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_88.location.sourceCode.object);
    }
    else {
      pVar8.object = parseExpression(this,false);
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x261d5f);
      (pSVar6->content).field_2._M_allocated_capacity = (size_type)pVar8.object;
    }
    bVar3 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIf<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x286aae);
    if (!bVar3) {
      pEVar10 = parseExpression(this,true);
      Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
      ::expect<soul::TokenType>(&this->super_SOULTokeniser,(TokenType)0x286aae);
      (pSVar6->content)._M_dataplus._M_p = (pointer)pEVar10;
    }
  }
  pSVar11 = parseStatement(this);
  ((pool_ptr<soul::AST::Statement> *)&(pSVar6->content)._M_string_length)->object = pSVar11;
  this->currentScope = pSVar2;
  return (Statement *)&pPVar5->item;
}

Assistant:

AST::Statement& parseForLoop()
    {
        expect (Operator::openParen);
        auto& block = allocate<AST::Block> (getContext(), nullptr);
        ScopedScope scope (*this, block);
        auto& loopStatement = allocate<AST::LoopStatement> (getContext());
        auto& loopInitialiser = parseStatement();
        block.addStatement (loopInitialiser);
        block.addStatement (loopStatement);

        if (matches (Operator::closeParen))
        {
            if (auto v = cast<AST::VariableDeclaration> (loopInitialiser))
            {
                loopStatement.rangeLoopInitialiser = v;
                v->doNotConstantFold = true;
                skip();
            }
            else
            {
                expect (Operator::semicolon);
            }
        }
        else
        {
            if (matchIf (Operator::semicolon))
                loopStatement.condition = allocate<AST::Constant> (AST::Context(), Value (true));
            else
                loopStatement.condition = matchEndOfStatement (parseExpression());

            if (! matchIf (Operator::closeParen))
                loopStatement.iterator = matchCloseParen (parseExpression (true));
        }

        loopStatement.body = parseStatement();
        return block;
    }